

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  ConductorBxDF *pCVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  BxDFFlags BVar7;
  uint64_t sequenceIndex;
  uint64_t seed;
  Tuple3<pbrt::Vector3,_float> *wi_00;
  int s;
  uint uVar8;
  Tuple3<pbrt::Vector3,_float> *wo_00;
  pbrt *this_00;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_01;
  float fVar9;
  Float FVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  Vector3<float> args_1;
  Vector3<float> args;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wi_01;
  Vector3f wi_02;
  float local_154;
  Point2f u;
  anon_class_8_1_ba1d750b r;
  Tuple3<pbrt::Vector3,_float> local_138;
  float local_128;
  uint uStack_124;
  undefined4 uStack_120;
  uint uStack_11c;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> rInterface;
  ulong local_108;
  Tuple3<pbrt::Vector3,_float> local_f8;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_e8;
  Tuple3<pbrt::Vector3,_float> local_d8;
  Tuple3<pbrt::Vector3,_float> local_c8;
  BSDFSample wos;
  BSDFSample wis;
  RNG rng;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_f8.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._8_56_ = wi._8_56_;
  auVar22._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_c8.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._8_56_ = wo._8_56_;
  auVar16._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11 = auVar16._0_16_;
  local_c8._0_8_ = vmovlps_avx(auVar11);
  local_f8._0_8_ = vmovlps_avx(auVar22._0_16_);
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
               ,0x41e,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  if (((this->config).twoSided == '\0') || (0.0 <= local_c8.z)) {
    uStack_120 = 0;
    uStack_124 = in_XMM3_Db;
    uStack_11c = in_XMM3_Dd;
    local_108 = auVar22._0_8_;
  }
  else {
    auVar21._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
    auVar21._8_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    auVar21._12_4_ = wi._12_4_ ^ 0x80000000;
    auVar11._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
    auVar11._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    auVar11._12_4_ = wo._12_4_ ^ 0x80000000;
    local_c8.z = -local_c8.z;
    local_f8.z = -local_f8.z;
    uStack_124 = in_XMM3_Db ^ 0x80000000;
    uStack_11c = in_XMM3_Dd ^ 0x80000000;
    local_c8._0_8_ = vmovlps_avx(auVar11);
    local_f8._0_8_ = vmovlps_avx(auVar21);
    uStack_120 = 0x80000000;
    local_108 = auVar21._0_8_;
  }
  fVar6 = local_c8.z;
  this_00 = (pbrt *)(ulong)*(uint *)(Options + 4);
  args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar11._0_8_;
  args_1.super_Tuple3<pbrt::Vector3,_float>.z = local_c8.z;
  local_128 = local_f8.z;
  sequenceIndex = Hash<int,pbrt::Vector3<float>>(*(uint *)(Options + 4),args_1);
  args.super_Tuple3<pbrt::Vector3,_float>.z = local_128;
  args.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_108;
  args.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
  seed = Hash<pbrt::Vector3<float>>(this_00,args);
  RNG::SetSequence(&rng,sequenceIndex,seed);
  local_154 = 0.0;
  r.rng = &rng;
  if (0.0 < local_128 * fVar6) {
    bVar2 = (this->config).nSamples;
    if (fVar6 <= 0.0) {
      wo_02.super_Tuple3<pbrt::Vector3,_float>.z = fVar6;
      wo_02.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      wo_02.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
      wi_02.super_Tuple3<pbrt::Vector3,_float>.z = local_128;
      wi_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_108;
      wi_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
      auVar18._0_4_ = ConductorBxDF::PDF(&this->bottom,wo_02,wi_02,mode,Reflection);
      auVar18._4_60_ = extraout_var_00;
      auVar11 = auVar18._0_16_;
    }
    else {
      wo_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar6;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
      wi_01.super_Tuple3<pbrt::Vector3,_float>.z = local_128;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_108;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
      auVar17._0_4_ = DielectricInterfaceBxDF::PDF(&this->top,wo_01,wi_01,mode,Reflection);
      auVar17._4_60_ = extraout_var;
      auVar11 = auVar17._0_16_;
    }
    auVar11 = vfmadd213ss_fma(auVar11,ZEXT416((uint)(float)bVar2),ZEXT416(0));
    local_154 = auVar11._0_4_;
  }
  pCVar1 = &this->bottom;
  uVar8 = 0;
  do {
    bVar2 = (this->config).nSamples;
    if (bVar2 <= uVar8) {
      return (local_154 / (float)bVar2) * 0.9 + 0.007957749;
    }
    if (local_c8.z * local_f8.z <= 0.0) {
      if (fVar6 <= 0.0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pCVar1;
        rInterface = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>)
                     (auVar4 << 0x40);
        local_e8.bottom = (ConductorBxDF *)0x0;
        local_e8.top = &this->top;
      }
      else {
        rInterface.bottom = (ConductorBxDF *)0x0;
        rInterface.top = &this->top;
        local_e8.bottom = pCVar1;
        local_e8.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)->
                        top;
      }
      local_128 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      fVar9 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      u.super_Tuple2<pbrt::Point2,_float>.y = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      u.super_Tuple2<pbrt::Point2,_float>.x = fVar9;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                (&wos,&rInterface,(Vector3f *)&local_c8,local_128,&u,mode,All);
      if (0.0 < wos.pdf) {
        if (((wos.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
            (NAN(wos.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
           (((undefined1)wos.flags & Reflection) == Unset)) {
          local_128 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
          fVar9 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
          u.super_Tuple2<pbrt::Point2,_float>.y = PDF::anon_class_8_1_ba1d750b::operator()(&r);
          u.super_Tuple2<pbrt::Point2,_float>.x = fVar9;
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                    (&wis,&local_e8,(Vector3f *)&local_f8,local_128,&u,(uint)(mode == Radiance),All)
          ;
          if (((0.0 < wis.pdf) &&
              ((wis.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
               (NAN(wis.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) &&
             (((undefined1)wis.flags & Reflection) == Unset)) {
            BVar7 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                              (&rInterface);
            if ((BVar7 & Specular) == Unset) {
              BVar7 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                (&local_e8);
              if ((BVar7 & Specular) == Unset) {
                auVar12._0_8_ = wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                ;
                auVar12._8_4_ = 0x80000000;
                auVar12._12_4_ = 0x80000000;
                local_138.z = -wis.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_138._0_8_ = vmovlps_avx(auVar12);
                local_128 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::PDF
                                      (&rInterface,(Vector3f *)&local_c8,(Vector3f *)&local_138,mode
                                       ,All);
                auVar13._0_8_ = wos.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                ;
                auVar13._8_4_ = 0x80000000;
                auVar13._12_4_ = 0x80000000;
                local_d8.z = -wos.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_d8._0_8_ = vmovlps_avx(auVar13);
                FVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::PDF
                                   (&local_e8,(Vector3f *)&local_d8,(Vector3f *)&local_f8,mode,All);
                fVar9 = (FVar10 + local_128) * 0.5;
              }
              else {
                auVar15._0_8_ = wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                ;
                auVar15._8_4_ = 0x80000000;
                auVar15._12_4_ = 0x80000000;
                local_138.z = -wis.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_138._0_8_ = vmovlps_avx(auVar15);
                fVar9 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::PDF
                                  (&rInterface,(Vector3f *)&local_c8,(Vector3f *)&local_138,mode,All
                                  );
              }
            }
            else {
              auVar14._0_8_ = wos.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar14._8_4_ = 0x80000000;
              auVar14._12_4_ = 0x80000000;
              local_138.z = -wos.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              local_138._0_8_ = vmovlps_avx(auVar14);
              fVar9 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::PDF
                                (&local_e8,(Vector3f *)&local_138,(Vector3f *)&local_f8,mode,All);
            }
            local_154 = local_154 + fVar9;
          }
        }
      }
    }
    else {
      local_e8.bottom = SUB168(ZEXT816(0),4);
      if (fVar6 <= 0.0) {
        rInterface.bottom = (ConductorBxDF *)0x0;
        rInterface.top = &this->top;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = pCVar1;
        local_e8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>)
                   (auVar5 << 0x40);
      }
      else {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = pCVar1;
        rInterface = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>)
                     (auVar3 << 0x40);
        local_e8.top = &this->top;
      }
      local_128 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      fVar9 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      u.super_Tuple2<pbrt::Point2,_float>.y = PDF::anon_class_8_1_ba1d750b::operator()(&r);
      u.super_Tuple2<pbrt::Point2,_float>.x = fVar9;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                (&wos,&local_e8,(Vector3f *)&local_c8,local_128,&u,mode,All);
      if (((wos.pdf <= 0.0) ||
          ((wos.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
           (!NAN(wos.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) ||
         (((undefined1)wos.flags & Reflection) != Unset)) {
        this_01 = &local_e8;
        wi_00 = &local_f8;
        wo_00 = &local_c8;
      }
      else {
        local_128 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
        fVar9 = PDF::anon_class_8_1_ba1d750b::operator()(&r);
        u.super_Tuple2<pbrt::Point2,_float>.y = PDF::anon_class_8_1_ba1d750b::operator()(&r);
        u.super_Tuple2<pbrt::Point2,_float>.x = fVar9;
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                  (&wis,&local_e8,(Vector3f *)&local_f8,local_128,&u,(uint)(mode == Radiance),All);
        if ((wis.pdf <= 0.0) ||
           (((wis.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
             (!NAN(wis.wi.super_Tuple3<pbrt::Vector3,_float>.z))) ||
            (((undefined1)wis.flags & Reflection) != Unset)))) goto LAB_0039efd2;
        this_01 = &rInterface;
        wi_00 = &local_d8;
        auVar19._0_8_ = wos.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar19._8_4_ = 0x80000000;
        auVar19._12_4_ = 0x80000000;
        local_138.z = -wos.wi.super_Tuple3<pbrt::Vector3,_float>.z;
        local_d8.z = -wis.wi.super_Tuple3<pbrt::Vector3,_float>.z;
        local_138._0_8_ = vmovlps_avx(auVar19);
        auVar20._0_8_ = wis.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar20._8_4_ = 0x80000000;
        auVar20._12_4_ = 0x80000000;
        local_d8._0_8_ = vmovlps_avx(auVar20);
        wo_00 = &local_138;
      }
      FVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::PDF
                         (this_01,(Vector3f *)wo_00,(Vector3f *)wi_00,mode,All);
      local_154 = local_154 + FVar10;
    }
LAB_0039efd2:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        // Update _pdfSum_ for reflection at the entrance layer
        if (SameHemisphere(wo, wi)) {
            if (enteredTop)
                pdfSum += config.nSamples *
                          top.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
            else
                pdfSum += config.nSamples *
                          bottom.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = tInterface.Sample_f(wo, uc, u, mode);

                // Update _pdfSum_ accounting for TRT scattering events
                if (!wos || wos.wi.z == 0 || wos.IsReflection()) {
                    pdfSum += tInterface.PDF(wo, wi, mode);
                } else {
                    uc = r();
                    u = Point2f(r(), r());
                    BSDFSample wis = tInterface.Sample_f(wi, uc, u, ~mode);
                    if (!wis || wis.wi.z == 0 || wis.IsReflection())
                        continue;
                    // if (IsSpecular(tInterface.Flags()))
                    pdfSum += rInterface.PDF(-wos.wi, -wis.wi, mode);
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || wos.wi.z == 0 || wos.IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                BSDFSample wis = tiInterface.Sample_f(wi, uc, u, ~mode);
                if (!wis || wis.wi.z == 0 || wis.IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos.wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis.wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis.wi, mode) +
                               tiInterface.PDF(-wos.wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(.9, 1 / (4 * Pi), pdfSum / config.nSamples);
    }